

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnInitExprV128ConstExpr
          (BinaryReaderIR *this,Index index,v128 value)

{
  _func_int **__s;
  Expr *pEVar1;
  ExprList *pEVar2;
  Expr *node_p;
  Expr *pEVar3;
  Expr *pEVar4;
  ExprList *pEVar5;
  
  __s = (_func_int **)this->filename_;
  pEVar1 = (Expr *)((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  pEVar3 = (Expr *)strlen((char *)__s);
  pEVar2 = this->current_init_expr_;
  pEVar4 = (Expr *)operator_new(0x88);
  (pEVar4->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  (pEVar4->loc).filename.data_ = (char *)__s;
  (pEVar4->loc).filename.size_ = (size_type)pEVar3;
  (pEVar4->loc).field_1.field_1.offset = (size_t)pEVar1;
  (pEVar4->loc).field_1.field_0.last_column = 0;
  pEVar4->type_ = Const;
  pEVar4->_vptr_Expr = (_func_int **)&PTR__Expr_002ce5d8;
  pEVar4[1]._vptr_Expr = __s;
  pEVar4[1].super_intrusive_list_base<wabt::Expr>.next_ = pEVar3;
  pEVar4[1].super_intrusive_list_base<wabt::Expr>.prev_ = pEVar1;
  *(undefined4 *)&pEVar4[1].loc.filename.data_ = 0;
  *(undefined4 *)&pEVar4[1].loc.filename.size_ = 0xfffffffb;
  pEVar4[1].loc.field_1.field_1.offset = value.v._0_8_;
  *(long *)((long)&pEVar4[1].loc.field_1 + 8) = value.v._8_8_;
  pEVar4[1].type_ = AtomicLoad;
  pEVar1 = pEVar2->last_;
  pEVar5 = pEVar2;
  if (pEVar1 != (Expr *)0x0) {
    (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar1;
    pEVar5 = (ExprList *)&pEVar1->super_intrusive_list_base<wabt::Expr>;
  }
  pEVar5->first_ = pEVar4;
  pEVar2->last_ = pEVar4;
  pEVar2->size_ = pEVar2->size_ + 1;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnInitExprV128ConstExpr(Index index, v128 value) {
  Location loc = GetLocation();
  current_init_expr_->push_back(
      MakeUnique<ConstExpr>(Const::V128(value, loc), loc));
  return Result::Ok;
}